

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  ushort uVar1;
  ushort uVar2;
  MessageOptions *pMVar3;
  FileOptions *pFVar4;
  FileDescriptor *pFVar5;
  ushort *puVar6;
  void *pvVar7;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view declared_type_name;
  code *pcVar8;
  bool bVar9;
  Descriptor *pDVar10;
  FieldOptions *pFVar11;
  ExtensionRange *pEVar12;
  void **ppvVar13;
  const_iterator cVar14;
  undefined8 *puVar15;
  FieldDescriptorProto *in_RCX;
  char *pcVar16;
  ulong uVar17;
  undefined8 *puVar18;
  DescriptorBuilder *this_00;
  ErrorLocation location;
  char *error;
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *this_01;
  undefined4 uVar19;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view haystack;
  string_view element_name_06;
  string_view message_name;
  string_view element_name_07;
  string_view input;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view declared_full_name;
  basic_string_view<char,_std::char_traits<char>_> __x;
  FieldDescriptor *field_local;
  string *local_80;
  code *pcStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  string *local_60;
  code *pcStack_58;
  string local_50;
  
  field_local = field;
  if (this->pool_->lazily_build_dependencies_ == true) {
    if (field == (FieldDescriptor *)0x0) {
      return;
    }
    pDVar10 = FieldDescriptor::message_type(field);
    if (pDVar10 == (Descriptor *)0x0) {
      return;
    }
  }
  ValidateFieldFeatures(this,field,proto);
  if ((1000 < (int)field->file_->edition_) && ((~field->field_0x3 & 6) != 0)) {
    pcVar16 = (field->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name._M_str = pcVar16 + ~element_name._M_len;
    in_RCX = proto;
    AddError(this,element_name,&proto->super_Message,TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use the feature string_type = VIEW|CORD|STRING|... instead."
            );
  }
  pFVar11 = field->options_;
  if ((((pFVar11->field_0)._impl_.lazy_ != false) ||
      ((pFVar11->field_0)._impl_.unverified_lazy_ == true)) && (field->type_ != '\v')) {
    pcVar16 = (field->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_00._M_str = pcVar16 + ~element_name_00._M_len;
    in_RCX = proto;
    AddError(this,element_name_00,&proto->super_Message,TYPE,
             "[lazy = true] can only be specified for submessage fields.");
    pFVar11 = field->options_;
  }
  if (((pFVar11->field_0)._impl_.packed_ == true) &&
     (bVar9 = FieldDescriptor::is_packable(field), !bVar9)) {
    pcVar16 = (field->all_names_).payload_;
    element_name_01._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_01._M_str = pcVar16 + ~element_name_01._M_len;
    in_RCX = proto;
    AddError(this,element_name_01,&proto->super_Message,TYPE,
             "[packed = true] can only be specified for repeated primitive fields.");
  }
  if (((field->containing_type_ != (Descriptor *)0x0) &&
      (pMVar3 = field->containing_type_->options_,
      pMVar3 != (MessageOptions *)_MessageOptions_default_instance_)) &&
     ((pMVar3->field_0)._impl_.message_set_wire_format_ == true)) {
    if ((field->field_0x1 & 8) == 0) {
      pcVar16 = (field->all_names_).payload_;
      uVar17 = (ulong)*(ushort *)(pcVar16 + 2);
      pcVar16 = pcVar16 + ~uVar17;
      error = "MessageSets cannot have fields, only extensions.";
      location = NAME;
    }
    else {
      if ((((field->merged_features_->field_0)._impl_.field_presence_ != 3) &&
          (bVar9 = FieldDescriptor::is_repeated(field), !bVar9)) && (field->type_ == '\v'))
      goto LAB_001dde99;
      pcVar16 = (field->all_names_).payload_;
      uVar17 = (ulong)*(ushort *)(pcVar16 + 2);
      pcVar16 = pcVar16 + ~uVar17;
      error = "Extensions of MessageSets must be optional messages.";
      location = TYPE;
    }
    element_name_02._M_str = pcVar16;
    element_name_02._M_len = uVar17;
    in_RCX = proto;
    AddError(this,element_name_02,&proto->super_Message,location,error);
  }
LAB_001dde99:
  if ((((field->file_ != (FileDescriptor *)0x0) &&
       (pFVar4 = field->file_->options_, pFVar4 != (FileOptions *)_FileOptions_default_instance_))
      && (((pFVar4->field_0)._impl_.optimize_for_ == 3 &&
          (field->containing_type_ != (Descriptor *)0x0)))) &&
     (((pFVar5 = field->containing_type_->file_, pFVar5 == (FileDescriptor *)0x0 ||
       (pFVar4 = pFVar5->options_, pFVar4 == (FileOptions *)_FileOptions_default_instance_)) ||
      ((pFVar4->field_0)._impl_.optimize_for_ != 3)))) {
    pcVar16 = (field->all_names_).payload_;
    element_name_03._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_03._M_str = pcVar16 + ~element_name_03._M_len;
    in_RCX = proto;
    AddError(this,element_name_03,&proto->super_Message,EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite files.  Note that you cannot extend a non-lite type to contain a lite type, but the reverse is allowed."
            );
  }
  bVar9 = FieldDescriptor::is_map(field);
  if ((bVar9) && (bVar9 = ValidateMapEntry(this,field,proto), !bVar9)) {
    pcVar16 = (field->all_names_).payload_;
    element_name_04._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_04._M_str = pcVar16 + ~element_name_04._M_len;
    in_RCX = proto;
    AddError(this,element_name_04,&proto->super_Message,TYPE,
             "map_entry should not be set explicitly. Use map<KeyType, ValueType> instead.");
  }
  ValidateJSType(this,field,proto);
  if ((~field->field_0x1 & 0xc) == 0) {
    puVar6 = (ushort *)(field->all_names_).payload_;
    uVar1 = puVar6[6];
    uVar2 = puVar6[7];
    input._M_len = (long)puVar6 + ~(ulong)*puVar6;
    input._M_str = (char *)in_RCX;
    protobuf::(anonymous_namespace)::ToJsonName_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)*puVar6,input);
    __y._M_str = local_50._M_dataplus._M_p;
    __y._M_len = local_50._M_string_length;
    __x._M_str = (char *)((long)puVar6 - (ulong)uVar1);
    __x._M_len = (ulong)uVar2;
    bVar9 = std::operator!=(__x,__y);
    std::__cxx11::string::~string((string *)&local_50);
    in_RCX = (FieldDescriptorProto *)local_50._M_dataplus._M_p;
    if (bVar9) {
      pcVar16 = (field->all_names_).payload_;
      element_name_05._M_len = (ulong)*(ushort *)(pcVar16 + 2);
      element_name_05._M_str = pcVar16 + ~element_name_05._M_len;
      in_RCX = proto;
      AddError(this,element_name_05,&proto->super_Message,OPTION_NAME,
               "option json_name is not allowed on extension fields.");
    }
  }
  pcVar16 = (field->all_names_).payload_;
  this_00 = (DescriptorBuilder *)(ulong)*(ushort *)(pcVar16 + 0xe);
  haystack._M_len = (long)pcVar16 - (ulong)*(ushort *)(pcVar16 + 0xc);
  haystack._M_str = (char *)0x0;
  bVar9 = absl::lts_20250127::StrContains((lts_20250127 *)this_00,haystack,(char)in_RCX);
  if (bVar9) {
    pcVar16 = (field->all_names_).payload_;
    element_name_06._M_len = (ulong)*(ushort *)(pcVar16 + 2);
    element_name_06._M_str = pcVar16 + ~element_name_06._M_len;
    this_00 = this;
    AddError(this,element_name_06,&proto->super_Message,OPTION_NAME,
             "json_name cannot have embedded null characters.");
  }
  if (((field->field_0x1 & 8) != 0) &&
     (pcVar16 = (field->containing_type_->all_names_).payload_,
     message_name._M_len = (ulong)*(ushort *)(pcVar16 + 2),
     message_name._M_str = pcVar16 + ~message_name._M_len,
     bVar9 = DescriptorPool::IsReadyForCheckingDescriptorExtDecl
                       ((DescriptorPool *)this_00,message_name), !bVar9)) {
    pEVar12 = Descriptor::FindExtensionRangeContainingNumber(field->containing_type_,field->number_)
    ;
    if ((pEVar12->options_ != (ExtensionRangeOptions *)0x0) &&
       ((byte)(this->pool_->enforce_extension_declarations_ - kCustomExtensions) < 2)) {
      this_01 = &(pEVar12->options_->field_0)._impl_.declaration_;
      ppvVar13 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
      cVar14 = RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::end(this_01);
      do {
        if (ppvVar13 == cVar14.it_) {
          if ((*(int *)((long)&pEVar12->options_->field_0 + 0x28) == 0) &&
             ((pEVar12->options_->field_0)._impl_.verification_ != 0)) {
            return;
          }
          pcVar16 = (field->all_names_).payload_;
          uVar17 = (ulong)*(ushort *)(pcVar16 + 2);
          pcVar16 = pcVar16 + ~uVar17;
          local_80 = &local_50;
          pcStack_78 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
          ;
          pcVar8 = pcStack_78;
          pcStack_78._0_4_ = 0x1ea11b;
          uVar19 = pcStack_78._0_4_;
          pcStack_78 = pcVar8;
          goto LAB_001de12b;
        }
        pvVar7 = *ppvVar13;
        ppvVar13 = ppvVar13 + 1;
      } while (*(int *)((long)pvVar7 + 0x28) != field->number_);
      if (*(char *)((long)pvVar7 + 0x2c) == '\x01') {
        pcVar16 = (field->all_names_).payload_;
        uVar17 = (ulong)*(ushort *)(pcVar16 + 2);
        pcVar16 = pcVar16 + ~uVar17;
        local_60 = &local_50;
        pcStack_58 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        pcVar8 = pcStack_58;
        pcStack_58._0_4_ = 0x1ea092;
        uVar19 = pcStack_58._0_4_;
        pcStack_58 = pcVar8;
LAB_001de12b:
        local_50._M_dataplus._M_p = (pointer)&field_local;
        make_error.invoker_._0_4_ = uVar19;
        make_error.ptr_.obj = &local_50;
        make_error.invoker_._4_4_ = 0;
        element_name_07._M_str = pcVar16;
        element_name_07._M_len = uVar17;
        AddError(this,element_name_07,&proto->super_Message,EXTENDEE,make_error);
      }
      else {
        puVar15 = (undefined8 *)(*(ulong *)((long)pvVar7 + 0x18) & 0xfffffffffffffffc);
        puVar18 = (undefined8 *)(*(ulong *)((long)pvVar7 + 0x20) & 0xfffffffffffffffc);
        uStack_68 = *puVar18;
        local_70 = puVar18[1];
        declared_type_name._M_str._0_4_ = (int)uStack_68;
        declared_type_name._M_len = local_70;
        declared_type_name._M_str._4_4_ = (int)((ulong)uStack_68 >> 0x20);
        declared_full_name._M_str = (char *)*puVar15;
        declared_full_name._M_len = puVar15[1];
        CheckExtensionDeclaration
                  (this,field,proto,declared_full_name,declared_type_name,
                   *(bool *)((long)pvVar7 + 0x2d));
      }
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateOptions(const FieldDescriptor* field,
                                        const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }

  ValidateFieldFeatures(field, proto);

  if (field->file()->edition() >= Edition::EDITION_2024 &&
      field->has_legacy_proto_ctype()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "ctype option is not allowed under edition 2024 and beyond. Use "
             "the feature string_type = VIEW|CORD|STRING|... instead.");
  }

  // Only message type fields may be lazy.
  if (field->options().lazy() || field->options().unverified_lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if ((field->is_required() || field->is_repeated()) ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (calculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // a user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

  if (absl::StrContains(field->json_name(), '\0')) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "json_name cannot have embedded null characters.");
  }


  // If this is a declared extension, validate that the actual name and type
  // match the declaration.
  if (field->is_extension()) {
    if (pool_->IsReadyForCheckingDescriptorExtDecl(
            field->containing_type()->full_name())) {
      return;
    }
    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range->options_ == nullptr) {
      return;
    }

    if (pool_->EnforceCustomExtensionDeclarations()) {
      for (const auto& declaration : extension_range->options_->declaration()) {
        if (declaration.number() != field->number()) continue;
        if (declaration.reserved()) {
          AddError(
              field->full_name(), proto,
              DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                return absl::Substitute(
                    "Cannot use number $0 for extension field $1, as it is "
                    "reserved in the extension declarations for message $2.",
                    field->number(), field->full_name(),
                    field->containing_type()->full_name());
              });
          return;
        }
        CheckExtensionDeclaration(*field, proto, declaration.full_name(),
                                  declaration.type(), declaration.repeated());
        return;
      }

      // Either no declarations, or there are but no matches. If there are no
      // declarations, we check its verification state. If there are other
      // non-matching declarations, we enforce that this extension must also be
      // declared.
      if (!extension_range->options_->declaration().empty() ||
          (extension_range->options_->verification() ==
           ExtensionRangeOptions::DECLARATION)) {
        AddError(
            field->full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
            [&] {
              return absl::Substitute(
                  "Missing extension declaration for field $0 with number $1 "
                  "in extendee message $2. An extension range must declare for "
                  "all extension fields if its verification state is "
                  "DECLARATION or there's any declaration in the range "
                  "already. Otherwise, consider splitting up the range.",
                  field->full_name(), field->number(),
                  field->containing_type()->full_name());
            });
        return;
      }
    }
  }
}